

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  int iVar1;
  string *extraout_RAX;
  string *psVar2;
  ostream *poVar3;
  size_t sVar4;
  pointer pcVar5;
  undefined1 local_58 [8];
  string full_flag;
  char local_29;
  
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  sVar4 = 6;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(full_flag.field_2._8_8_ + 0x10),"gtest_",6);
  poVar3 = (ostream *)(full_flag.field_2._8_8_ + 0x10);
  if (this == (internal *)0x0) {
    this = (internal *)"(null)";
  }
  else {
    sVar4 = strlen((char *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)this,sVar4);
  Message::GetString_abi_cxx11_((string *)local_58,(Message *)((long)&full_flag.field_2 + 8));
  if (full_flag.field_2._8_8_ != 0) {
    (**(code **)(*(long *)full_flag.field_2._8_8_ + 8))();
  }
  Message::Message((Message *)((long)&full_flag.field_2 + 8));
  if (full_flag._M_dataplus._M_p != (pointer)0x0) {
    pcVar5 = (pointer)0x0;
    do {
      iVar1 = toupper((uint)*(byte *)((long)local_58 + (long)pcVar5));
      local_29 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(full_flag.field_2._8_8_ + 0x10),&local_29,1);
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != full_flag._M_dataplus._M_p);
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)((long)&full_flag.field_2 + 8));
  if (full_flag.field_2._8_8_ != 0) {
    (**(code **)(*(long *)full_flag.field_2._8_8_ + 8))();
  }
  psVar2 = (string *)&full_flag._M_string_length;
  if (local_58 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_58,full_flag._M_string_length + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}